

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

int __thiscall QColorDialogPrivate::init(QColorDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  QColor *color;
  QPlatformColorDialogHelper *pQVar2;
  long in_FS_OFFSET;
  QColorDialog *q;
  QColorDialogPrivate *in_stack_000002f0;
  QColorDialogPrivate *title;
  QWidget *in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffef;
  QDialog *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  title = this;
  color = (QColor *)q_func(this);
  QDialog::setSizeGripEnabled(in_stack_fffffffffffffff0,(bool)in_stack_ffffffffffffffef);
  QColorDialog::tr((char *)color,(char *)this,(int)((ulong)color >> 0x20));
  QWidget::setWindowTitle(in_stack_ffffffffffffffe0,(QString *)title);
  QString::~QString((QString *)0x737d0b);
  pQVar2 = platformColorDialogHelper((QColorDialogPrivate *)0x737d15);
  (this->super_QDialogPrivate).nativeDialogInUse = pQVar2 != (QPlatformColorDialogHelper *)0x0;
  this->colorPickingEventFilter = (QColorPickingEventFilter *)0x0;
  this->nextCust = 0;
  if (((this->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
    initWidgets(in_stack_000002f0);
  }
  QColorDialog::setCurrentColor((QColorDialog *)this,color);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::init(const QColor &initial)
{
    Q_Q(QColorDialog);

    q->setSizeGripEnabled(false);
    q->setWindowTitle(QColorDialog::tr("Select Color"));

    // default: use the native dialog if possible.  Can be overridden in setOptions()
    nativeDialogInUse = (platformColorDialogHelper() != nullptr);
    colorPickingEventFilter = nullptr;
    nextCust = 0;

    if (!nativeDialogInUse)
        initWidgets();

#ifdef Q_OS_WIN32
    dummyTransparentWindow.resize(1, 1);
    dummyTransparentWindow.setFlags(Qt::Tool | Qt::FramelessWindowHint);
#endif

    q->setCurrentColor(initial);
}